

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O0

void * __thiscall
tvm::runtime::WorkspacePool::Pool::Alloc(Pool *this,TVMContext ctx,DeviceAPI *device,size_t nbytes)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pEVar5;
  reference pEVar6;
  undefined4 extraout_var_01;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  local_88;
  const_iterator local_80;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  local_78;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  local_70;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  local_68;
  __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
  it;
  undefined1 auStack_38 [4];
  TVMType type;
  Entry e;
  size_t nbytes_local;
  DeviceAPI *device_local;
  Pool *this_local;
  TVMContext ctx_local;
  
  e.size = nbytes + 0xfff & 0xfffffffffffff000;
  if (e.size == 0) {
    e.size = 0x1000;
  }
  sVar3 = std::
          vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
          ::size(&this->free_list_);
  if (sVar3 == 2) {
    pvVar4 = std::
             vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ::back(&this->free_list_);
    _auStack_38 = pvVar4->data;
    uVar1 = pvVar4->size;
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ::pop_back(&this->free_list_);
    if (uVar1 < e.size) {
      (*device->_vptr_DeviceAPI[5])(device,ctx,_auStack_38);
      iVar2 = (*device->_vptr_DeviceAPI[4])(device,ctx,e.size,0x40,0x10801);
      _auStack_38 = (void *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    sVar3 = std::
            vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
            ::size(&this->free_list_);
    if (sVar3 == 1) {
      it._M_current._4_4_ = 0x10801;
      iVar2 = (*device->_vptr_DeviceAPI[4])(device,ctx,e.size,0x40,0x10801);
      _auStack_38 = (void *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      pvVar4 = std::
               vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ::back(&this->free_list_);
      if (pvVar4->size < e.size) {
        pvVar4 = std::
                 vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                 ::back(&this->free_list_);
        _auStack_38 = pvVar4->data;
        std::
        vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
        ::pop_back(&this->free_list_);
        (*device->_vptr_DeviceAPI[5])(device,ctx,_auStack_38);
        iVar2 = (*device->_vptr_DeviceAPI[4])(device,ctx,e.size,0x40,0x10801);
        _auStack_38 = (void *)CONCAT44(extraout_var_01,iVar2);
      }
      else {
        local_70._M_current =
             (Entry *)std::
                      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                      ::end(&this->free_list_);
        local_68 = __gnu_cxx::
                   __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
                   ::operator-(&local_70,2);
        while (pEVar5 = __gnu_cxx::
                        __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
                        ::operator->(&local_68), e.size <= pEVar5->size) {
          __gnu_cxx::
          __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
          ::operator--(&local_68);
        }
        local_78 = __gnu_cxx::
                   __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
                   ::operator+(&local_68,1);
        pEVar6 = __gnu_cxx::
                 __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
                 ::operator*(&local_78);
        _auStack_38 = pEVar6->data;
        local_88 = __gnu_cxx::
                   __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_*,_std::vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>_>
                   ::operator+(&local_68,1);
        __gnu_cxx::
        __normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_const*,std::vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>>
        ::__normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry*>
                  ((__normal_iterator<tvm::runtime::WorkspacePool::Pool::Entry_const*,std::vector<tvm::runtime::WorkspacePool::Pool::Entry,std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>>>
                    *)&local_80,&local_88);
        std::
        vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
        ::erase(&this->free_list_,local_80);
      }
    }
  }
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::push_back(&this->allocated_,(value_type *)auStack_38);
  return _auStack_38;
}

Assistant:

void *Alloc(TVMContext ctx, DeviceAPI *device, size_t nbytes) {
    // Allocate align to page.
    nbytes = (nbytes + (kWorkspacePageSize - 1)) / kWorkspacePageSize * kWorkspacePageSize;
    if (nbytes == 0)
      nbytes = kWorkspacePageSize;
    Entry e;
    TVMType type;
    type.code = kDLUInt;
    type.bits = 8;
    type.lanes = 1;
    if (free_list_.size() == 2) {
      e = free_list_.back();
      free_list_.pop_back();
      if (e.size < nbytes) {
        // resize the page
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    } else if (free_list_.size() == 1) {
      e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
      e.size = nbytes;
    } else {
      if (free_list_.back().size >= nbytes) {
        // find smallest fit
        auto it = free_list_.end() - 2;
        for (; it->size >= nbytes; --it) {
        }
        e = *(it + 1);
        free_list_.erase(it + 1);
      } else {
        // resize the page
        e = free_list_.back();
        free_list_.pop_back();
        device->FreeDataSpace(ctx, e.data);
        e.data = device->AllocDataSpace(ctx, nbytes, kTempAllocaAlignment, type);
        e.size = nbytes;
      }
    }
    allocated_.push_back(e);
    return e.data;
  }